

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksDB.cpp
# Opt level: O2

TalkRef * __thiscall
cppti::TalksDB::talkRefFromTalk(TalkRef *__return_storage_ptr__,TalksDB *this,Talk *talk)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  difference_type __d;
  ulong uVar5;
  pointer pSVar6;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  Speaker local_70;
  string local_50;
  
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->title)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->title).field_2;
  (__return_storage_ptr__->title)._M_string_length = 0;
  (__return_storage_ptr__->title).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->slides).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (__return_storage_ptr__->conference)._M_len = 0;
  (__return_storage_ptr__->conference)._M_str = (char *)0x0;
  __return_storage_ptr__->year = 0;
  (__return_storage_ptr__->link)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->link).field_2
  ;
  (__return_storage_ptr__->link)._M_string_length = 0;
  (__return_storage_ptr__->link).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>::
  reserve(&__return_storage_ptr__->speakers,
          (long)(talk->speakers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(talk->speakers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (talk->speakers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (talk->speakers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar7);
    toSnakeCase(&local_50);
    pSVar6 = (this->speakers).
             super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->speakers).
                  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 6;
    while (uVar8 = uVar5, 0 < (long)uVar8) {
      uVar5 = uVar8 >> 1;
      bVar3 = std::operator<(&pSVar6[uVar5].id,&local_50);
      if (bVar3) {
        pSVar6 = pSVar6 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar8;
      }
    }
    local_70.id._M_str = (pSVar6->id)._M_dataplus._M_p;
    local_70.id._M_len = (pSVar6->id)._M_string_length;
    local_70.display_name._M_str = (pSVar6->display_name)._M_dataplus._M_p;
    local_70.display_name._M_len = (pSVar6->display_name)._M_string_length;
    std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
    ::emplace_back<cppti::TalksDB::TalkRef::Speaker>(&__return_storage_ptr__->speakers,&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  _Var4 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->conferences).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->conferences).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&talk->conference);
  pcVar2 = ((_Var4._M_current)->_M_dataplus)._M_p;
  (__return_storage_ptr__->conference)._M_len = (_Var4._M_current)->_M_string_length;
  (__return_storage_ptr__->conference)._M_str = pcVar2;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&__return_storage_ptr__->tags,
            (long)(talk->tags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(talk->tags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (talk->tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (talk->tags).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    _Var4 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                      ((this->tags).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->tags).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pbVar7);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::__cxx11::string&>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&__return_storage_ptr__->tags,_Var4._M_current);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->title);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__return_storage_ptr__->slides,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&talk->slides);
  __return_storage_ptr__->year = talk->year;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->link);
  return __return_storage_ptr__;
}

Assistant:

TalksDB::TalkRef TalksDB::talkRefFromTalk(Talk const& talk)
{
  auto ret = TalkRef{};

  ret.speakers.reserve(talk.speakers.size());
  for (auto const& speaker : talk.speakers)
  {
    auto id = speaker;
    toSnakeCase(id);
    auto const& index_speaker = *std::lower_bound(
        this->speakers.begin(),
        this->speakers.end(),
        id,
        [&](auto const& hay, auto const& needle) { return hay.id < needle; });
    ret.speakers.emplace_back(
        TalkRef::Speaker{index_speaker.id, index_speaker.display_name});
  }

  ret.conference = *std::lower_bound(
      this->conferences.begin(), this->conferences.end(), talk.conference);

  ret.tags.reserve(talk.tags.size());
  for (auto const& tag : talk.tags)
    ret.tags.emplace_back(
        *std::lower_bound(this->tags.begin(), this->tags.end(), tag));

  ret.title = talk.title;
  ret.slides = talk.slides;
  ret.year = talk.year;
  ret.link = talk.link;
  return ret;
}